

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.h
# Opt level: O3

void __thiscall dh::trival::~trival(trival *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->_val2).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_val2).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_val1).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_val1).name.field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_operand)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_operand).field_2) {
    operator_delete(pcVar1);
  }
  pcVar1 = (this->_res).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->_res).name.field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

trival( ::std::string operand)
		{
			this->_operand = operand;
			size = 0;
		}